

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::VertexIDCase::renderReference
          (VertexIDCase *this,PixelBufferAccess *dst,int numVertices,deUint16 *indices,
          Vec4 *positions,Vec4 *colors)

{
  Renderer referenceRenderer;
  VertexIDReferenceShader referenceShader;
  RenderTarget referenceTarget;
  Renderer local_365;
  int local_364;
  Program local_360;
  VertexAttrib local_348;
  undefined8 uStack_320;
  undefined8 local_318;
  Vec4 *pVStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  int local_2f8;
  int iStack_2f4;
  undefined8 uStack_2f0;
  DrawIndices local_2e8;
  VertexIDReferenceShader local_2d8;
  DrawCommand local_268;
  RenderState local_238;
  PrimitiveList local_148;
  RenderTarget local_128;
  
  local_364 = numVertices;
  rr::Renderer::Renderer(&local_365);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&local_2d8,dst);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_128,
             (MultisamplePixelBufferAccess *)&local_2d8);
  _local_2f8 = local_128._12_8_;
  uStack_2f0 = 0;
  local_238.cullMode = CULLMODE_NONE;
  local_238.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  local_238.rasterization.winding = WINDING_CCW;
  local_238.rasterization.horizontalFill = FILL_LEFT;
  local_238.rasterization.verticalFill = FILL_BOTTOM;
  local_238.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState(&local_238.fragOps);
  local_238.point.pointSize = 1.0;
  local_238.viewport.rect.left = 0;
  local_238.viewport.rect.bottom = 0;
  local_238.viewport.rect.width = local_2f8;
  local_238.viewport.rect.height = iStack_2f4;
  local_238.viewport.zn = 0.0;
  local_238.viewport.zf = 1.0;
  local_238.line.lineWidth = 1.0;
  local_238.restart.enabled = false;
  local_238.restart.restartIndex = 0xffffffff;
  local_238.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  local_238.rasterization._8_8_ = local_238.rasterization._8_8_ & 0xffffffff;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&local_2d8,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_348);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_268);
  rr::RenderTarget::RenderTarget
            (&local_128,(MultisamplePixelBufferAccess *)&local_2d8,
             (MultisamplePixelBufferAccess *)&local_348,(MultisamplePixelBufferAccess *)&local_268);
  VertexIDReferenceShader::VertexIDReferenceShader(&local_2d8);
  local_348.generic.v._0_8_ = 0;
  local_348.generic.v._8_8_ = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_348.type = VERTEXATTRIBTYPE_FLOAT;
  local_348.size = 4;
  local_348.stride = 0;
  local_348.instanceDivisor = 0;
  uStack_320 = 0x400000000;
  local_318 = 0;
  local_360.geometryShader = (GeometryShader *)0x0;
  local_360.vertexShader = &local_2d8.super_VertexShader;
  local_360.fragmentShader = &local_2d8.super_FragmentShader;
  local_348.pointer = positions;
  pVStack_310 = colors;
  rr::DrawIndices::DrawIndices(&local_2e8,indices,0);
  rr::PrimitiveList::PrimitiveList(&local_148,PRIMITIVETYPE_TRIANGLES,local_364,&local_2e8);
  local_268.state = &local_238;
  local_268.program = &local_360;
  local_268.numVertexAttribs = 2;
  local_268.renderTarget = &local_128;
  local_268.vertexAttribs = &local_348;
  local_268.primitives = &local_148;
  rr::Renderer::draw(&local_365,&local_268);
  rr::FragmentShader::~FragmentShader(&local_2d8.super_FragmentShader);
  rr::VertexShader::~VertexShader(&local_2d8.super_VertexShader);
  rr::Renderer::~Renderer(&local_365);
  return;
}

Assistant:

void VertexIDCase::renderReference (const tcu::PixelBufferAccess& dst, const int numVertices, const deUint16* const indices, const tcu::Vec4* const positions, const tcu::Vec4* const colors)
{
	const rr::Renderer				referenceRenderer;
	const rr::RenderState			referenceState		((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst)));
	const rr::RenderTarget			referenceTarget		(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst));
	const VertexIDReferenceShader	referenceShader;
	      rr::VertexAttrib			attribs[2];

	attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[0].size				= 4;
	attribs[0].stride			= 0;
	attribs[0].instanceDivisor	= 0;
	attribs[0].pointer			= positions;

	attribs[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[1].size				= 4;
	attribs[1].stride			= 0;
	attribs[1].instanceDivisor	= 0;
	attribs[1].pointer			= colors;

	referenceRenderer.draw(
		rr::DrawCommand(
			referenceState,
			referenceTarget,
			rr::Program(&referenceShader, &referenceShader),
			2,
			attribs,
			rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, numVertices, rr::DrawIndices(indices))));
}